

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O1

Expr * __thiscall SQCompilation::SQParser::PrefixedExpr(SQParser *this)

{
  long lVar1;
  Arena *this_00;
  SQInteger SVar2;
  SQInteger SVar3;
  Expr **ppEVar4;
  CallExpr *pCVar5;
  int iVar6;
  int iVar7;
  CallExpr *pCVar8;
  Expr *pEVar9;
  Chunk *pCVar10;
  char *pcVar11;
  int iVar12;
  SQInteger *in_RSI;
  bool bVar13;
  
  if (500 < this->_depth) {
    in_RSI = (SQInteger *)0x1d;
    reportDiagnostic(this,0x1d);
  }
  this->_depth = this->_depth + 1;
  pCVar8 = (CallExpr *)Factor(this,in_RSI);
  iVar12 = 1;
  bVar13 = false;
LAB_00163f65:
  while( true ) {
    if (500 < this->_depth) {
      reportDiagnostic(this,0x1d);
    }
    this->_depth = this->_depth + 1;
    iVar12 = iVar12 + 1;
    lVar1 = this->_token;
    if (lVar1 < 0x147) break;
    if (lVar1 < 0x155) {
      if (lVar1 == 0x147) {
LAB_00164185:
        bVar13 = true;
        goto LAB_00164188;
      }
      if (lVar1 == 0x149) goto LAB_00164051;
      goto LAB_00164313;
    }
    if (lVar1 == 0x155) {
LAB_00163ffc:
      if (bVar13) goto LAB_00164002;
    }
    else {
      if (lVar1 != 0x156) goto LAB_00164313;
LAB_00164002:
      bVar13 = true;
    }
    Lex(this);
    if (((this->_lex)._prevflags & 3) != 0) {
      if (lVar1 < 0x155) {
        pcVar11 = ".";
        if (lVar1 != 0x2e) {
          if (lVar1 == 0x146) {
            pcVar11 = "?.";
          }
          else {
LAB_0016423f:
            pcVar11 = "<unknown>";
          }
        }
      }
      else if (lVar1 == 0x155) {
        pcVar11 = ".$";
      }
      else {
        if (lVar1 != 0x156) goto LAB_0016423f;
        pcVar11 = "?.$";
      }
      reportDiagnostic(this,0x35,pcVar11);
    }
    SVar2 = (this->_lex)._currentline;
    SVar3 = (this->_lex)._currentcolumn;
    pEVar9 = Expect(this,0x102);
    ppEVar4 = (Expr **)pEVar9[1].super_Node.super_ArenaObj._vptr_ArenaObj;
    pCVar10 = Arena::findChunk(this->_astArena,0x40);
    pCVar5 = (CallExpr *)pCVar10->_ptr;
    pCVar10->_ptr = &pCVar5->_nullable;
    (pCVar5->super_Expr).super_Node._op = TO_GETFIELD;
    (pCVar5->super_Expr).super_Node._coordinates.lineStart = -1;
    (pCVar5->super_Expr).super_Node._coordinates.columnStart = -1;
    (pCVar5->super_Expr).super_Node._coordinates.lineEnd = -1;
    (pCVar5->super_Expr).super_Node._coordinates.columnEnd = -1;
    pCVar5->_callee = &pCVar8->super_Expr;
    *(bool *)&(pCVar5->_args)._arena = bVar13;
    (pCVar5->_args)._vals = ppEVar4;
    (pCVar5->super_Expr).super_Node.super_ArenaObj._vptr_ArenaObj =
         (_func_int **)&PTR__ArenaObj_001a4bb8;
    *(bool *)&(pCVar5->_args)._size = lVar1 - 0x155U < 2;
    iVar6 = (pCVar8->super_Expr).super_Node._coordinates.columnStart;
    (pCVar5->super_Expr).super_Node._coordinates.lineStart =
         (pCVar8->super_Expr).super_Node._coordinates.lineStart;
    (pCVar5->super_Expr).super_Node._coordinates.columnStart = iVar6;
    (pCVar5->super_Expr).super_Node._coordinates.lineEnd = (int)SVar2;
    (pCVar5->super_Expr).super_Node._coordinates.columnEnd = (int)SVar3;
    pCVar8 = pCVar5;
  }
  if (lVar1 < 0x5b) {
    if (lVar1 != 0x28) {
      if (lVar1 == 0x2e) goto LAB_00163ffc;
      goto LAB_00164313;
    }
LAB_00164051:
    if ((lVar1 == 0x28) && (((this->_lex)._prevflags & 1) != 0)) {
      reportDiagnostic(this,0x37);
    }
    this_00 = this->_astArena;
    if (this->_token == 0x149) {
      bVar13 = true;
    }
    iVar6 = (pCVar8->super_Expr).super_Node._coordinates.lineStart;
    iVar7 = (pCVar8->super_Expr).super_Node._coordinates.columnStart;
    pCVar10 = Arena::findChunk(this_00,0x48);
    pCVar5 = (CallExpr *)pCVar10->_ptr;
    pCVar10->_ptr = (uint8_t *)(pCVar5 + 1);
    (pCVar5->super_Expr).super_Node._op = TO_CALL;
    (pCVar5->super_Expr).super_Node._coordinates.lineStart = -1;
    (pCVar5->super_Expr).super_Node._coordinates.columnStart = -1;
    (pCVar5->super_Expr).super_Node._coordinates.lineEnd = -1;
    (pCVar5->super_Expr).super_Node._coordinates.columnEnd = -1;
    (pCVar5->super_Expr).super_Node.super_ArenaObj._vptr_ArenaObj =
         (_func_int **)&PTR__ArenaObj_001a4b80;
    pCVar5->_callee = &pCVar8->super_Expr;
    (pCVar5->_args)._arena = this_00;
    (pCVar5->_args)._vals = (Expr **)0x0;
    (pCVar5->_args)._size = 0;
    (pCVar5->_args)._allocated = 0;
    pCVar5->_nullable = bVar13;
    if (this->_token == 0x28) {
      checkSuspiciousBracket(this);
    }
    Lex(this);
    while (this->_token != 0x29) {
      pEVar9 = Expression(this,SQE_FUNCTION_ARG);
      CallExpr::addArgument(pCVar5,pEVar9);
      if (this->_token == 0x2c) {
        Lex(this);
      }
    }
    (pCVar5->super_Expr).super_Node._coordinates.lineStart = iVar6;
    (pCVar5->super_Expr).super_Node._coordinates.columnStart = iVar7;
    (pCVar5->super_Expr).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
    (pCVar5->super_Expr).super_Node._coordinates.columnEnd = (int)(this->_lex)._currentcolumn;
    Lex(this);
    pCVar8 = pCVar5;
    goto LAB_00163f65;
  }
  if (lVar1 == 0x5b) {
    if (bVar13 != false) goto LAB_00164185;
LAB_00164188:
    if ((this->_lex)._prevtoken == 10) {
      reportDiagnostic(this,0x1f);
    }
    if (this->_token == 0x5b) {
      checkSuspiciousBracket(this);
    }
    Lex(this);
    pEVar9 = Expression(this,SQE_RVALUE);
    pCVar10 = Arena::findChunk(this->_astArena,0x38);
    pCVar5 = (CallExpr *)pCVar10->_ptr;
    pCVar10->_ptr = (uint8_t *)&(pCVar5->_args)._size;
    (pCVar5->super_Expr).super_Node._op = TO_GETSLOT;
    (pCVar5->super_Expr).super_Node._coordinates.lineStart = -1;
    (pCVar5->super_Expr).super_Node._coordinates.columnStart = -1;
    (pCVar5->super_Expr).super_Node._coordinates.lineEnd = -1;
    (pCVar5->super_Expr).super_Node._coordinates.columnEnd = -1;
    pCVar5->_callee = &pCVar8->super_Expr;
    *(bool *)&(pCVar5->_args)._arena = bVar13;
    (pCVar5->_args)._vals = (Expr **)pEVar9;
    (pCVar5->super_Expr).super_Node.super_ArenaObj._vptr_ArenaObj =
         (_func_int **)&PTR__ArenaObj_001a4c60;
    iVar6 = (pCVar8->super_Expr).super_Node._coordinates.columnStart;
    (pCVar5->super_Expr).super_Node._coordinates.lineStart =
         (pCVar8->super_Expr).super_Node._coordinates.lineStart;
    (pCVar5->super_Expr).super_Node._coordinates.columnStart = iVar6;
    (pCVar5->super_Expr).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
    (pCVar5->super_Expr).super_Node._coordinates.columnEnd = (int)(this->_lex)._currentcolumn;
    Expect(this,0x5d);
    pCVar8 = pCVar5;
    goto LAB_00163f65;
  }
  if (lVar1 == 0x146) goto LAB_00164002;
  if ((lVar1 - 0x12fU < 2) && ((this->_lex)._prevtoken != 10)) {
    if (lVar1 < 0x7d) {
      if ((lVar1 == 0) || (lVar1 == 0x3b)) goto LAB_00164313;
    }
    else if ((lVar1 == 0x7d) || (lVar1 == 0x14c)) goto LAB_00164313;
    pCVar10 = Arena::findChunk(this->_astArena,0x30);
    pCVar5 = (CallExpr *)pCVar10->_ptr;
    pCVar10->_ptr = (uint8_t *)&(pCVar5->_args)._vals;
    *(undefined8 *)&(pCVar5->super_Expr).super_Node._op = 0x10000003c;
    (pCVar5->super_Expr).super_Node._coordinates.lineStart = -1;
    (pCVar5->super_Expr).super_Node._coordinates.columnStart = -1;
    (pCVar5->super_Expr).super_Node._coordinates.lineEnd = -1;
    (pCVar5->super_Expr).super_Node._coordinates.columnEnd = -1;
    (pCVar5->super_Expr).super_Node.super_ArenaObj._vptr_ArenaObj =
         (_func_int **)&PTR__ArenaObj_001a4aa0;
    *(uint *)&pCVar5->_callee = ((lVar1 != 0x130) - 1) + (uint)(lVar1 != 0x130);
    (pCVar5->_args)._arena = (Arena *)pCVar8;
    iVar6 = (pCVar8->super_Expr).super_Node._coordinates.columnStart;
    (pCVar5->super_Expr).super_Node._coordinates.lineStart =
         (pCVar8->super_Expr).super_Node._coordinates.lineStart;
    (pCVar5->super_Expr).super_Node._coordinates.columnStart = iVar6;
    (pCVar5->super_Expr).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
    (pCVar5->super_Expr).super_Node._coordinates.columnEnd = (int)(this->_lex)._currentcolumn;
    Lex(this);
    pCVar8 = pCVar5;
  }
LAB_00164313:
  this->_depth = this->_depth - iVar12;
  return &pCVar8->super_Expr;
}

Assistant:

Expr* SQParser::PrefixedExpr()
{
    NestingChecker nc(this);
    //if 'pos' != -1 the previous variable is a local variable
    SQInteger pos;
    Expr *e = Factor(pos);
    bool nextIsNullable = false;
    for(;;) {
        nc.inc();
        switch(_token) {
        case _SC('.'):
        case TK_NULLGETSTR:
        case TK_TYPE_METHOD_GETSTR:
        case TK_NULLABLE_TYPE_METHOD_GETSTR: {
            if (_token == TK_NULLGETSTR || _token == TK_NULLABLE_TYPE_METHOD_GETSTR || nextIsNullable) {
                nextIsNullable = true;
            }

            bool isTypeMethod = _token == TK_TYPE_METHOD_GETSTR || _token == TK_NULLABLE_TYPE_METHOD_GETSTR;

            SQInteger tok = _token;

            Lex();

            if ((_lex._prevflags & (TF_PREP_SPACE | TF_PREP_EOL)) != 0) {
              reportDiagnostic(DiagnosticsId::DI_SPACE_SEP_FIELD_NAME, opname(tok));
            }

            SQInteger l = _lex._currentline, c = _lex._currentcolumn;
            Expr *receiver = e;
            Id *id = (Id *)Expect(TK_IDENTIFIER);
            assert(id);
            e = newNode<GetFieldExpr>(receiver, id->id(), nextIsNullable, isTypeMethod); //-V522
            e->setLineStartPos(receiver->lineStart()); e->setColumnStartPos(receiver->columnStart());
            e->setLineEndPos(l); e->setColumnEndPos(c);
            break;
        }
        case _SC('['):
        case TK_NULLGETOBJ: {
            if (_token == TK_NULLGETOBJ || nextIsNullable)
            {
                nextIsNullable = true;
            }
            if(_lex._prevtoken == _SC('\n'))
                reportDiagnostic(DiagnosticsId::DI_BROKEN_SLOT_DECLARATION);
            if (_token == _SC('['))
              checkSuspiciousBracket();

            Lex();
            Expr *receiver = e;
            Expr *key = Expression(SQE_RVALUE);
            e = setCoordinates(newNode<GetSlotExpr>(receiver, key, nextIsNullable), receiver->lineStart(), receiver->columnStart());
            Expect(_SC(']'));
            break;
        }
        case TK_MINUSMINUS:
        case TK_PLUSPLUS:
            {
                nextIsNullable = false;
                if(IsEndOfStatement()) return e;
                SQInteger diff = (_token==TK_MINUSMINUS) ? -1 : 1;
                e = setCoordinates(newNode<IncExpr>(e, diff, IF_POSTFIX), e->lineStart(), e->columnStart());
                Lex();
            }
            return e;
        case _SC('('):
        case TK_NULLCALL: {
            if (_lex._prevflags & TF_PREP_EOL && _token == _SC('(')) {
                reportDiagnostic(DiagnosticsId::DI_PAREN_IS_FUNC_CALL);
            }
            SQInteger nullcall = (_token==TK_NULLCALL || nextIsNullable);
            nextIsNullable = !!nullcall;
            SQInteger l = e->lineStart(), c = e->columnStart();
            CallExpr *call = newNode<CallExpr>(arena(), e, nullcall);

            if (_token == _SC('('))
              checkSuspiciousBracket();

            Lex();
            while (_token != _SC(')')) {
                call->addArgument(Expression(SQE_FUNCTION_ARG));
                if (_token == _SC(',')) {
                    Lex();
                }
            }

            setCoordinates(call, l, c);

            Lex();
            e = call;
            break;
        }
        default: return e;
        }
    }
}